

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O1

void deepFreeData(Data data)

{
  DataType DVar1;
  
  DVar1 = data->type;
  if (DVar1 == ArrayType) {
    freeArray((data->val).a);
  }
  else if (DVar1 == ObjectType) {
    freeObject((data->val).o);
  }
  else if (DVar1 == StringType) {
    freeString((data->val).s);
  }
  free(data);
  return;
}

Assistant:

void deepFreeData(Data data) {
    DataType t = data->type;
    if (t == StringType)
        freeString(data->val.s);
    if (t == ObjectType)
        freeObject(data->val.o);
    if (t == ArrayType)
        freeArray(data->val.a);
    free(data);
}